

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::
btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*>
::increment_slow(btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*>
                 *this)

{
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
  bVar1;
  int iVar2;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
  *pbVar3;
  undefined8 uVar4;
  bool bVar5;
  byte i;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
  *pbVar6;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
  *pbVar7;
  char *__function;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*>
  save;
  int iStack_20;
  
  pbVar7 = this->node_;
  if (((ulong)pbVar7 & 7) == 0) {
    iVar2 = this->position_;
    if (pbVar7[0xb] ==
        (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
         )0x0) {
      if ((int)(uint)(byte)pbVar7[10] <= iVar2) {
        __assert_fail("position_ < node_->finish()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/btree.h"
                      ,0x85e,
                      "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>, 256, false>>, const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry &, const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry *>::increment_slow() [Node = absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>, 256, false>>, Reference = const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry &, Pointer = const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry *]"
                     );
      }
      i = (char)iVar2 + 1;
      while( true ) {
        pbVar7 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
                 ::child(pbVar7,i);
        this->node_ = pbVar7;
        if (((ulong)pbVar7 & 7) != 0) break;
        bVar1 = pbVar7[0xb];
        i = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
            ::start(pbVar7);
        if (bVar1 != (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
                      )0x0) {
          this->position_ = (uint)i;
          return;
        }
      }
    }
    else {
      if (iVar2 < (int)(uint)(byte)pbVar7[10]) {
        __assert_fail("position_ >= node_->finish()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/btree.h"
                      ,0x852,
                      "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>, 256, false>>, const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry &, const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry *>::increment_slow() [Node = absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>, 256, false>>, Reference = const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry &, Pointer = const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry *]"
                     );
      }
      pbVar3 = this->node_;
      uVar4 = *(undefined8 *)&this->position_;
      pbVar7 = this->node_;
      while (((ulong)pbVar7 & 7) == 0) {
        if ((this->position_ != (uint)(byte)pbVar7[10]) ||
           (bVar5 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
                    ::is_root(pbVar7), bVar5)) {
          if (((ulong)this->node_ & 7) == 0) {
            if (this->position_ != (uint)(byte)this->node_[10]) {
              return;
            }
            iStack_20 = (int)uVar4;
            this->position_ = iStack_20;
            this->node_ = pbVar3;
            return;
          }
          break;
        }
        pbVar7 = this->node_;
        if (((ulong)pbVar7 & 7) != 0) {
          __function = 
          "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>, 256, false>> *, unsigned int, unsigned char, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 5, 6>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>, 256, false>> *, unsigned int, unsigned char, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 5, 6>, RuntimeSizeSeq = std::integer_sequence<unsigned long>,..." /* TRUNCATED STRING LITERAL */
          ;
          goto LAB_0027ce14;
        }
        pbVar6 = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
                 ::child(*(btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
                           **)pbVar7,(field_type)pbVar7[8]);
        pbVar7 = this->node_;
        if (pbVar6 != pbVar7) {
          __assert_fail("node_->parent()->child(node_->position()) == node_",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/btree.h"
                        ,0x855,
                        "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>, 256, false>>, const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry &, const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry *>::increment_slow() [Node = absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>, 256, false>>, Reference = const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry &, Pointer = const google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry *]"
                       );
        }
        if (((ulong)pbVar7 & 7) != 0) break;
        this->position_ = (uint)(byte)pbVar7[8];
        pbVar7 = *(btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>
                   **)pbVar7;
        this->node_ = pbVar7;
      }
    }
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>, 256, false>> *, unsigned int, unsigned char, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 5, 6>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>, 256, false>> *, unsigned int, unsigned char, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 5, 6>, RuntimeSizeSeq = std::integer_sequence<unsigned long>,..." /* TRUNCATED STRING LITERAL */
  ;
LAB_0027ce14:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,__function);
}

Assistant:

void btree_iterator<N, R, P>::increment_slow() {
  if (node_->is_leaf()) {
    assert(position_ >= node_->finish());
    btree_iterator save(*this);
    while (position_ == node_->finish() && !node_->is_root()) {
      assert(node_->parent()->child(node_->position()) == node_);
      position_ = node_->position();
      node_ = node_->parent();
    }
    // TODO(ezb): assert we aren't incrementing end() instead of handling.
    if (position_ == node_->finish()) {
      *this = save;
    }
  } else {
    assert(position_ < node_->finish());
    node_ = node_->child(static_cast<field_type>(position_ + 1));
    while (node_->is_internal()) {
      node_ = node_->start_child();
    }
    position_ = node_->start();
  }
}